

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::SendProxyMessage
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aDstAddr,string *aUriPath)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Error *pEVar4;
  Error local_250;
  ErrorCode local_224;
  ResponseHandler local_220;
  ErrorCode local_1fc;
  Error local_1f8;
  ErrorCode local_1cc;
  Tlv local_1c8;
  Error local_1a8;
  ErrorCode local_17c;
  Error local_178;
  ErrorCode local_14c;
  Error local_148;
  undefined1 local_120 [8];
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_f0 [8];
  Request request;
  Address dstAddr;
  Error error;
  string *aUriPath_local;
  string *aDstAddr_local;
  ErrorHandler *aHandler_local;
  CommissionerImpl *this_local;
  
  Error::Error((Error *)&dstAddr.mBytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  Address::Address((Address *)&request.mEndpoint);
  coap::Message::Message((Message *)local_f0,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)local_120,aHandler);
  Address::Set(&local_148,(Address *)&request.mEndpoint,aDstAddr);
  pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_148)
  ;
  local_14c = kNone;
  bVar1 = commissioner::operator!=(pEVar4,&local_14c);
  Error::~Error(&local_148);
  if (!bVar1) {
    coap::Message::SetUriPath(&local_178,(Message *)local_f0,aUriPath);
    pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              &local_178);
    local_17c = kNone;
    bVar1 = commissioner::operator!=(pEVar4,&local_17c);
    Error::~Error(&local_178);
    if (!bVar1) {
      iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[7])();
      tlv::Tlv::Tlv(&local_1c8,kCommissionerSessionId,(uint16_t)iVar2,kMeshCoP);
      AppendTlv(&local_1a8,(Message *)local_f0,&local_1c8);
      pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                &local_1a8);
      local_1cc = kNone;
      bVar1 = commissioner::operator!=(pEVar4,&local_1cc);
      Error::~Error(&local_1a8);
      tlv::Tlv::~Tlv(&local_1c8);
      if (!bVar1) {
        uVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
        if ((uVar3 & 1) != 0) {
          SignRequest(&local_1f8,this,(Request *)local_f0,kMeshCoP,true);
          pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    &local_1f8);
          local_1fc = kNone;
          bVar1 = commissioner::operator!=(pEVar4,&local_1fc);
          Error::~Error(&local_1f8);
          if (bVar1) goto LAB_001bb8d1;
        }
        std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
        function<ot::commissioner::CommissionerImpl::SendProxyMessage(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0&,void>
                  ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *
                   )&local_220,(anon_class_32_1_d0c21527 *)local_120);
        ProxyClient::SendRequest
                  (&this->mProxyClient,(Request *)local_f0,&local_220,(Address *)&request.mEndpoint,
                   0xf0bf);
        std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
        ~function(&local_220);
      }
    }
  }
LAB_001bb8d1:
  local_224 = kNone;
  bVar1 = commissioner::operator!=
                    ((Error *)&dstAddr.mBytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_224);
  if (bVar1) {
    Error::Error(&local_250,
                 (Error *)&dstAddr.mBytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,&local_250);
    Error::~Error(&local_250);
  }
  SendProxyMessage(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::$_0::~__0((__0 *)local_120);
  coap::Message::~Message((Message *)local_f0);
  Address::~Address((Address *)&request.mEndpoint);
  Error::~Error((Error *)&dstAddr.mBytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CommissionerImpl::SendProxyMessage(ErrorHandler aHandler, const std::string &aDstAddr, const std::string &aUriPath)
{
    Error         error;
    Address       dstAddr;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError, /* aStateTlvIsMandatory */ false));
    };

    SuccessOrExit(error = dstAddr.Set(aDstAddr));

    SuccessOrExit(error = request.SetUriPath(aUriPath));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mProxyClient.SendRequest(request, onResponse, dstAddr, kDefaultMmPort);

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}